

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O2

DFsSection * __thiscall DFsScript::FindSectionStart(DFsScript *this,char *brace)

{
  DFsSection *pDVar1;
  
  pDVar1 = (DFsSection *)(this->sections + (long)(((int)brace - *(int *)&this->data) % 0x11) + -7);
  do {
    pDVar1 = GC::ReadBarrier<DFsSection>((DFsSection **)&pDVar1->next);
    if (pDVar1 == (DFsSection *)0x0) {
      return (DFsSection *)0x0;
    }
  } while (this->data + pDVar1->start_index != brace);
  return pDVar1;
}

Assistant:

DFsSection *DFsScript::FindSectionStart(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *current = sections[n];
	
	// use the hash table: check the appropriate hash chain
	
	while(current)
    {
		if(SectionStart(current) == brace) return current;
		current = current->next;
    }
	
	return NULL;    // not found
}